

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_packbits.c
# Opt level: O0

int PackBitsEncode(TIFF *tif,uint8_t *buf,tmsize_t cc,uint16_t s)

{
  uint8_t uVar1;
  char cVar2;
  uint8_t *puVar3;
  long lVar4;
  int iVar5;
  uint8_t *puVar6;
  bool bVar7;
  char cVar8;
  anon_enum_32 state;
  int b;
  long slop;
  long n;
  uint8_t *lastliteral;
  uint8_t *ep;
  uint8_t *op;
  uchar *bp;
  long lStack_28;
  uint16_t s_local;
  tmsize_t cc_local;
  uint8_t *buf_local;
  TIFF *tif_local;
  
  puVar3 = tif->tif_rawdata;
  lVar4 = tif->tif_rawdatasize;
  cVar8 = '\0';
  n = 0;
  ep = tif->tif_rawcp;
  op = buf;
  lStack_28 = cc;
  do {
    if (lStack_28 < 1) {
      tif->tif_rawcc = (tmsize_t)(ep + (tif->tif_rawcc - (long)tif->tif_rawcp));
      tif->tif_rawcp = ep;
      return 1;
    }
    uVar1 = *op;
    slop = 1;
    while( true ) {
      lStack_28 = lStack_28 + -1;
      op = op + 1;
      bVar7 = false;
      if (0 < lStack_28) {
        bVar7 = uVar1 == *op;
      }
      if (!bVar7) break;
      slop = slop + 1;
    }
LAB_003ebfae:
    if (puVar3 + lVar4 <= ep + 2) {
      if ((cVar8 == '\x01') || (cVar8 == '\x03')) {
        tif->tif_rawcc = (n - (long)tif->tif_rawcp) + tif->tif_rawcc;
        iVar5 = TIFFFlushData1(tif);
        if (iVar5 == 0) {
          return 0;
        }
        _state = (long)ep - n;
        ep = tif->tif_rawcp;
        while (0 < _state) {
          *ep = *(uint8_t *)n;
          _state = _state + -1;
          n = n + 1;
          ep = ep + 1;
        }
        n = (long)tif->tif_rawcp;
      }
      else {
        tif->tif_rawcc = (tmsize_t)(ep + (tif->tif_rawcc - (long)tif->tif_rawcp));
        iVar5 = TIFFFlushData1(tif);
        if (iVar5 == 0) {
          return 0;
        }
        ep = tif->tif_rawcp;
      }
    }
    cVar2 = (char)slop;
    switch(cVar8) {
    case '\0':
      if (slop < 2) {
        n = (long)ep;
        *ep = '\0';
        ep[1] = uVar1;
        cVar8 = '\x01';
      }
      else {
        cVar8 = '\x02';
        if (0x80 < slop) {
          puVar6 = ep + 1;
          *ep = 0x81;
          ep = ep + 2;
          *puVar6 = uVar1;
          slop = slop + -0x80;
          goto LAB_003ebfae;
        }
        *ep = -(cVar2 + -1);
        ep[1] = uVar1;
      }
      ep = ep + 2;
      break;
    case '\x01':
      if (slop < 2) {
        cVar2 = *(char *)n;
        *(char *)n = cVar2 + '\x01';
        if ((char)(cVar2 + '\x01') == '\x7f') {
          cVar8 = '\0';
        }
        *ep = uVar1;
        ep = ep + 1;
        break;
      }
      cVar8 = '\x03';
      if (slop < 0x81) {
        *ep = -(cVar2 + -1);
        ep[1] = uVar1;
        ep = ep + 2;
        break;
      }
      puVar6 = ep + 1;
      *ep = 0x81;
      ep = ep + 2;
      *puVar6 = uVar1;
      slop = slop + -0x80;
      goto LAB_003ebfae;
    case '\x02':
      if (slop < 2) {
        n = (long)ep;
        *ep = '\0';
        ep[1] = uVar1;
        cVar8 = '\x01';
        goto LAB_003ec333;
      }
      if (0x80 < slop) {
        puVar6 = ep + 1;
        *ep = 0x81;
        ep = ep + 2;
        *puVar6 = uVar1;
        slop = slop + -0x80;
        goto LAB_003ebfae;
      }
      *ep = -(cVar2 + -1);
      ep[1] = uVar1;
LAB_003ec333:
      ep = ep + 2;
      break;
    case '\x03':
      if (((slop == 1) && (ep[-2] == 0xff)) && (*(byte *)n < 0x7e)) {
        cVar8 = *(char *)n;
        *(char *)n = cVar8 + '\x02';
        cVar8 = (char)(cVar8 + '\x02') != '\x7f';
        ep[-2] = ep[-1];
      }
      else {
        cVar8 = '\x02';
      }
      goto LAB_003ebfae;
    default:
      break;
    }
  } while( true );
}

Assistant:

static int PackBitsEncode(TIFF *tif, uint8_t *buf, tmsize_t cc, uint16_t s)
{
    unsigned char *bp = (unsigned char *)buf;
    uint8_t *op;
    uint8_t *ep;
    uint8_t *lastliteral;
    long n, slop;
    int b;
    enum
    {
        BASE,
        LITERAL,
        RUN,
        LITERAL_RUN
    } state;

    (void)s;
    op = tif->tif_rawcp;
    ep = tif->tif_rawdata + tif->tif_rawdatasize;
    state = BASE;
    lastliteral = 0;
    while (cc > 0)
    {
        /*
         * Find the longest string of identical bytes.
         */
        b = *bp++;
        cc--;
        n = 1;
        for (; cc > 0 && b == *bp; cc--, bp++)
            n++;
    again:
        if (op + 2 >= ep)
        { /* insure space for new data */
            /*
             * Be careful about writing the last
             * literal.  Must write up to that point
             * and then copy the remainder to the
             * front of the buffer.
             */
            if (state == LITERAL || state == LITERAL_RUN)
            {
                slop = (long)(op - lastliteral);
                tif->tif_rawcc += (tmsize_t)(lastliteral - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
                while (slop-- > 0)
                    *op++ = *lastliteral++;
                lastliteral = tif->tif_rawcp;
            }
            else
            {
                tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
                if (!TIFFFlushData1(tif))
                    return (0);
                op = tif->tif_rawcp;
            }
        }
        switch (state)
        {
            case BASE: /* initial state, set run/literal */
                if (n > 1)
                {
                    state = RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL: /* last object was literal string */
                if (n > 1)
                {
                    state = LITERAL_RUN;
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1)); /* encode run */
                    *op++ = (uint8_t)b;
                }
                else
                { /* extend literal */
                    if (++(*lastliteral) == 127)
                        state = BASE;
                    *op++ = (uint8_t)b;
                }
                break;
            case RUN: /* last object was run */
                if (n > 1)
                {
                    if (n > 128)
                    {
                        *op++ = (uint8_t)-127;
                        *op++ = (uint8_t)b;
                        n -= 128;
                        goto again;
                    }
                    *op++ = (uint8_t)(-(n - 1));
                    *op++ = (uint8_t)b;
                }
                else
                {
                    lastliteral = op;
                    *op++ = 0;
                    *op++ = (uint8_t)b;
                    state = LITERAL;
                }
                break;
            case LITERAL_RUN: /* literal followed by a run */
                /*
                 * Check to see if previous run should
                 * be converted to a literal, in which
                 * case we convert literal-run-literal
                 * to a single literal.
                 */
                if (n == 1 && op[-2] == (uint8_t)-1 && *lastliteral < 126)
                {
                    state = (((*lastliteral) += 2) == 127 ? BASE : LITERAL);
                    op[-2] = op[-1]; /* replicate */
                }
                else
                    state = RUN;
                goto again;
        }
    }
    tif->tif_rawcc += (tmsize_t)(op - tif->tif_rawcp);
    tif->tif_rawcp = op;
    return (1);
}